

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

uint8_t __thiscall cfd::core::AddressFormatData::GetP2shPrefix(AddressFormatData *this)

{
  uint32_t uVar1;
  allocator local_31;
  string local_30;
  AddressFormatData *local_10;
  AddressFormatData *this_local;
  
  local_10 = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_30,"p2sh",&local_31);
  uVar1 = GetValue(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return (uint8_t)uVar1;
}

Assistant:

uint8_t AddressFormatData::GetP2shPrefix() const {
  return static_cast<uint8_t>(GetValue(kPrefixP2sh));
}